

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureMipmapTests.cpp
# Opt level: O1

void deqp::gles3::Functional::getAffineTexCoord3D
               (vector<float,_std::allocator<float>_> *dst,int cellNdx)

{
  pointer pfVar1;
  float *pfVar2;
  int row_2;
  long lVar3;
  int row;
  long lVar4;
  Vector<float,_3> *pVVar5;
  long lVar6;
  float *pfVar7;
  Vector<float,_3> *__return_storage_ptr__;
  float v;
  float fVar8;
  float fVar9;
  undefined4 uVar10;
  Vec3 p3;
  Vec3 p2;
  Vec3 p0;
  Vec3 p1;
  Mat3 rotMatrix;
  undefined8 local_d8;
  float local_d0;
  undefined8 local_c8;
  float local_c0;
  float local_bc;
  Matrix<float,_3,_3> local_b8;
  Matrix<float,_3,_3> local_88;
  undefined8 local_58;
  float local_50;
  Vector<float,_3> local_4c [3];
  
  getBasicTexCoord3D(dst,cellNdx);
  pfVar2 = (float *)&local_b8;
  local_b8.m_data.m_data[1].m_data[1] = 0.0;
  local_b8.m_data.m_data[1].m_data[2] = 0.0;
  local_b8.m_data.m_data[2].m_data[0] = 0.0;
  local_b8.m_data.m_data[2].m_data[1] = 0.0;
  local_b8.m_data.m_data[0].m_data[0] = 0.0;
  local_b8.m_data.m_data[0].m_data[1] = 0.0;
  local_b8.m_data.m_data[0].m_data[2] = 0.0;
  local_b8.m_data.m_data[1].m_data[0] = 0.0;
  local_b8.m_data.m_data[2].m_data[2] = 0.0;
  lVar3 = 0;
  lVar4 = 0;
  do {
    lVar6 = 0;
    do {
      uVar10 = 0x3f800000;
      if (lVar3 != lVar6) {
        uVar10 = 0;
      }
      *(undefined4 *)((long)pfVar2 + lVar6) = uVar10;
      lVar6 = lVar6 + 0xc;
    } while (lVar6 != 0x24);
    lVar4 = lVar4 + 1;
    pfVar2 = pfVar2 + 1;
    lVar3 = lVar3 + 0xc;
  } while (lVar4 != 3);
  local_bc = (float)cellNdx * 0.0625 * 6.2831855 + 0.0;
  fVar8 = cosf(local_bc);
  local_b8.m_data.m_data[1].m_data[2] = sinf(local_bc);
  local_b8.m_data.m_data[2].m_data._0_8_ =
       CONCAT44(local_b8.m_data.m_data[1].m_data[2],local_b8.m_data.m_data[2].m_data[0]) ^
       0x8000000000000000;
  local_b8.m_data.m_data[1].m_data[1] = fVar8;
  pfVar2 = (float *)&local_88;
  local_88.m_data.m_data[1].m_data[1] = 0.0;
  local_88.m_data.m_data[1].m_data[2] = 0.0;
  local_88.m_data.m_data[2].m_data[0] = 0.0;
  local_88.m_data.m_data[2].m_data[1] = 0.0;
  local_88.m_data.m_data[0].m_data[0] = 0.0;
  local_88.m_data.m_data[0].m_data[1] = 0.0;
  local_88.m_data.m_data[0].m_data[2] = 0.0;
  local_88.m_data.m_data[1].m_data[0] = 0.0;
  local_88.m_data.m_data[2].m_data[2] = 0.0;
  lVar3 = 0;
  lVar4 = 0;
  do {
    lVar6 = 0;
    do {
      uVar10 = 0x3f800000;
      if (lVar3 != lVar6) {
        uVar10 = 0;
      }
      *(undefined4 *)((long)pfVar2 + lVar6) = uVar10;
      lVar6 = lVar6 + 0xc;
    } while (lVar6 != 0x24);
    lVar4 = lVar4 + 1;
    pfVar2 = pfVar2 + 1;
    lVar3 = lVar3 + 0xc;
  } while (lVar4 != 3);
  fVar9 = (float)cellNdx * 0.03125 * 6.2831855 + 1.0;
  local_b8.m_data.m_data[2].m_data[2] = fVar8;
  fVar8 = cosf(fVar9);
  fVar9 = sinf(fVar9);
  local_88.m_data.m_data[0].m_data[0] = fVar8;
  local_88.m_data.m_data[2].m_data[0] = fVar9;
  local_88.m_data.m_data._8_8_ = CONCAT44(local_88.m_data.m_data[1].m_data[0],fVar9) ^ 0x80000000;
  __return_storage_ptr__ = local_4c;
  local_88.m_data.m_data[2].m_data[2] = fVar8;
  tcu::operator*((Matrix<float,_3,_3> *)__return_storage_ptr__,&local_b8,&local_88);
  pfVar1 = (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  local_88.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)pfVar1;
  local_88.m_data.m_data[0].m_data[2] = pfVar1[2];
  local_b8.m_data.m_data[0].m_data[0] = 0.0;
  local_b8.m_data.m_data[0].m_data[1] = 0.0;
  local_b8.m_data.m_data[0].m_data[2] = 0.0;
  local_b8.m_data.m_data[1].m_data[0] = 0.0;
  lVar3 = 0;
  do {
    fVar8 = 0.0;
    lVar4 = 0;
    pVVar5 = __return_storage_ptr__;
    do {
      fVar8 = fVar8 + ((Vector<tcu::Vector<float,_3>,_3> *)pVVar5->m_data)->m_data[0].m_data[0] *
                      local_88.m_data.m_data[0].m_data[lVar4];
      lVar4 = lVar4 + 1;
      pVVar5 = pVVar5 + 1;
    } while (lVar4 != 3);
    local_b8.m_data.m_data[0].m_data[lVar3] = fVar8;
    lVar3 = lVar3 + 1;
    __return_storage_ptr__ = (Vector<float,_3> *)(__return_storage_ptr__->m_data + 1);
  } while (lVar3 != 3);
  local_c8 = *(undefined8 *)(pfVar1 + 3);
  local_c0 = pfVar1[5];
  local_88.m_data.m_data[0].m_data[0] = 0.0;
  local_88.m_data.m_data[0].m_data[1] = 0.0;
  local_88.m_data.m_data._8_8_ = (ulong)(uint)local_88.m_data.m_data[1].m_data[0] << 0x20;
  pfVar2 = local_4c[0].m_data;
  lVar3 = 0;
  do {
    fVar8 = 0.0;
    lVar4 = 0;
    pfVar7 = pfVar2;
    do {
      fVar8 = fVar8 + ((Vector<float,_3> *)pfVar7)->m_data[0] *
                      *(float *)((long)&local_c8 + lVar4 * 4);
      lVar4 = lVar4 + 1;
      pfVar7 = (float *)((long)pfVar7 + 0xc);
    } while (lVar4 != 3);
    local_88.m_data.m_data[0].m_data[lVar3] = fVar8;
    lVar3 = lVar3 + 1;
    pfVar2 = pfVar2 + 1;
  } while (lVar3 != 3);
  local_d8 = *(undefined8 *)(pfVar1 + 6);
  local_d0 = pfVar1[8];
  local_c8 = 0;
  local_c0 = 0.0;
  pfVar2 = local_4c[0].m_data;
  lVar3 = 0;
  do {
    fVar8 = 0.0;
    lVar4 = 0;
    pfVar7 = pfVar2;
    do {
      fVar8 = fVar8 + ((Vector<float,_3> *)pfVar7)->m_data[0] *
                      *(float *)((long)&local_d8 + lVar4 * 4);
      lVar4 = lVar4 + 1;
      pfVar7 = (float *)((long)pfVar7 + 0xc);
    } while (lVar4 != 3);
    *(float *)((long)&local_c8 + lVar3 * 4) = fVar8;
    lVar3 = lVar3 + 1;
    pfVar2 = pfVar2 + 1;
  } while (lVar3 != 3);
  local_58 = *(undefined8 *)(pfVar1 + 9);
  local_50 = pfVar1[0xb];
  local_d8 = 0;
  local_d0 = 0.0;
  pfVar2 = local_4c[0].m_data;
  lVar3 = 0;
  do {
    fVar8 = 0.0;
    lVar4 = 0;
    pfVar7 = pfVar2;
    do {
      fVar8 = fVar8 + ((Vector<float,_3> *)pfVar7)->m_data[0] *
                      *(float *)((long)&local_58 + lVar4 * 4);
      lVar4 = lVar4 + 1;
      pfVar7 = (float *)((long)pfVar7 + 0xc);
    } while (lVar4 != 3);
    *(float *)((long)&local_d8 + lVar3 * 4) = fVar8;
    lVar3 = lVar3 + 1;
    pfVar2 = pfVar2 + 1;
  } while (lVar3 != 3);
  *pfVar1 = local_b8.m_data.m_data[0].m_data[0];
  pfVar1[1] = local_b8.m_data.m_data[0].m_data[1];
  pfVar1[2] = local_b8.m_data.m_data[0].m_data[2];
  pfVar1[3] = local_88.m_data.m_data[0].m_data[0];
  pfVar1[4] = local_88.m_data.m_data[0].m_data[1];
  pfVar1[5] = local_88.m_data.m_data[0].m_data[2];
  pfVar1[6] = (float)local_c8;
  pfVar1[7] = local_c8._4_4_;
  pfVar1[8] = local_c0;
  pfVar1[9] = (float)local_d8;
  pfVar1[10] = local_d8._4_4_;
  pfVar1[0xb] = local_d0;
  return;
}

Assistant:

static void getAffineTexCoord3D (std::vector<float>& dst, int cellNdx)
{
	// Use basic coords as base.
	getBasicTexCoord3D(dst, cellNdx);

	// Rotate based on cell index.
	float		angleX		= 0.0f + 2.0f*DE_PI * ((float)cellNdx / 16.0f);
	float		angleY		= 1.0f + 2.0f*DE_PI * ((float)cellNdx / 32.0f);
	tcu::Mat3	rotMatrix	= tcu::rotationMatrixX(angleX) * tcu::rotationMatrixY(angleY);

	Vec3		p0			= rotMatrix * Vec3(dst[0], dst[ 1], dst[ 2]);
	Vec3		p1			= rotMatrix * Vec3(dst[3], dst[ 4], dst[ 5]);
	Vec3		p2			= rotMatrix * Vec3(dst[6], dst[ 7], dst[ 8]);
	Vec3		p3			= rotMatrix * Vec3(dst[9], dst[10], dst[11]);

	dst[0] = p0.x();	dst[ 1] = p0.y();	dst[ 2] = p0.z();
	dst[3] = p1.x();	dst[ 4] = p1.y();	dst[ 5] = p1.z();
	dst[6] = p2.x();	dst[ 7] = p2.y();	dst[ 8] = p2.z();
	dst[9] = p3.x();	dst[10] = p3.y();	dst[11] = p3.z();
}